

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall BezierCurve::ConvertToMeter(BezierCurve *this)

{
  double *pdVar1;
  BezierCurve *in_RDI;
  double lonDiff;
  ptTy *pt;
  double lat;
  
  pdVar1 = positionTy::lat(&in_RDI->end);
  lat = *pdVar1;
  pdVar1 = positionTy::lat(&in_RDI->start);
  lonDiff = Lat2Dist(lat - *pdVar1);
  pdVar1 = positionTy::lat(&in_RDI->end);
  *pdVar1 = lonDiff;
  positionTy::lon(&in_RDI->end);
  positionTy::lon(&in_RDI->start);
  positionTy::lat(&in_RDI->start);
  pt = (ptTy *)Lon2Dist(lonDiff,lat);
  pdVar1 = positionTy::lon(&in_RDI->end);
  *pdVar1 = (double)pt;
  ConvertToMeter(in_RDI,pt);
  return;
}

Assistant:

void BezierCurve::ConvertToMeter ()
{
    end.lat() = Lat2Dist(end.lat() - start.lat());
    end.lon() = Lon2Dist(end.lon() - start.lon(), start.lat());
    ConvertToMeter(ptCtrl);
}